

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsolver.hpp
# Opt level: O1

double __thiscall soplex::SPxSolverBase<double>::maxInfeas(SPxSolverBase<double> *this)

{
  long lVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  
  if (this->theType == ENTER) {
    dVar3 = 0.0;
    if ((this->m_pricingViolUpToDate != false) && (this->m_pricingViolCoUpToDate == true)) {
      dVar3 = this->m_pricingViol + this->m_pricingViolCo;
    }
    lVar1 = (long)(this->thecovectors->set).thenum;
    if (0 < lVar1) {
      lVar2 = 0;
      do {
        dVar4 = (this->theFvec->super_VectorBase<double>).val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar2];
        dVar5 = (this->theUBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar2];
        if (dVar4 <= dVar5) {
          dVar5 = (this->theLBbound).val.super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[lVar2];
          if ((dVar4 < dVar5) && (dVar5 = dVar5 - dVar4, dVar3 <= dVar5)) {
            dVar3 = dVar5;
          }
        }
        else {
          dVar4 = dVar4 - dVar5;
          if (dVar3 <= dVar4) {
            dVar3 = dVar4;
          }
        }
        lVar2 = lVar2 + 1;
      } while (lVar1 != lVar2);
    }
  }
  else {
    if (this->m_pricingViolUpToDate == false) {
      dVar3 = 0.0;
    }
    else {
      dVar3 = this->m_pricingViol;
    }
    lVar1 = (long)(this->thecovectors->set).thenum;
    if (0 < lVar1) {
      lVar2 = 0;
      do {
        dVar4 = (this->theCoPvec->super_VectorBase<double>).val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar2];
        dVar5 = (this->theCoUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                .super__Vector_impl_data._M_start[lVar2];
        if (dVar4 <= dVar5) {
          dVar5 = (this->theCoLbound->val).super__Vector_base<double,_std::allocator<double>_>.
                  _M_impl.super__Vector_impl_data._M_start[lVar2];
          if ((dVar4 < dVar5) && (dVar5 = dVar5 - dVar4, dVar3 <= dVar5)) {
            dVar3 = dVar5;
          }
        }
        else {
          dVar4 = dVar4 - dVar5;
          if (dVar3 <= dVar4) {
            dVar3 = dVar4;
          }
        }
        lVar2 = lVar2 + 1;
      } while (lVar1 != lVar2);
    }
    lVar1 = (long)(this->thevectors->set).thenum;
    if (0 < lVar1) {
      lVar2 = 0;
      do {
        dVar4 = (this->thePvec->super_VectorBase<double>).val.
                super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
                _M_start[lVar2];
        dVar5 = (this->theUbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar2];
        if (dVar4 <= dVar5) {
          dVar5 = (this->theLbound->val).super__Vector_base<double,_std::allocator<double>_>._M_impl
                  .super__Vector_impl_data._M_start[lVar2];
          if ((dVar4 < dVar5) && (dVar5 = dVar5 - dVar4, dVar3 <= dVar5)) {
            dVar3 = dVar5;
          }
        }
        else {
          dVar4 = dVar4 - dVar5;
          if (dVar3 <= dVar4) {
            dVar3 = dVar4;
          }
        }
        lVar2 = lVar2 + 1;
      } while (lVar1 != lVar2);
    }
  }
  return dVar3;
}

Assistant:

R SPxSolverBase<R>::maxInfeas() const
   {
      R inf = 0.0;

      if(type() == ENTER)
      {
         if(m_pricingViolUpToDate && m_pricingViolCoUpToDate)
            inf = m_pricingViol + m_pricingViolCo;

         for(int i = 0; i < dim(); i++)
         {
            if((*theFvec)[i] > theUBbound[i])
               inf = SOPLEX_MAX(inf, (*theFvec)[i] - theUBbound[i]);
            else if((*theFvec)[i] < theLBbound[i])
               inf = SOPLEX_MAX(inf, theLBbound[i] - (*theFvec)[i]);
         }
      }
      else
      {
         assert(type() == LEAVE);

         if(m_pricingViolUpToDate)
            inf = m_pricingViol;

         for(int i = 0; i < dim(); i++)
         {
            if((*theCoPvec)[i] > (*theCoUbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoPvec)[i] - (*theCoUbound)[i]);
            else if((*theCoPvec)[i] < (*theCoLbound)[i])
               inf = SOPLEX_MAX(inf, (*theCoLbound)[i] - (*theCoPvec)[i]);
         }

         for(int i = 0; i < coDim(); i++)
         {
            if((*thePvec)[i] > (*theUbound)[i])
               inf = SOPLEX_MAX(inf, (*thePvec)[i] - (*theUbound)[i]);
            else if((*thePvec)[i] < (*theLbound)[i])
               inf = SOPLEX_MAX(inf, (*theLbound)[i] - (*thePvec)[i]);
         }
      }

      return inf;
   }